

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_time.c
# Opt level: O2

int p2sc_string2date(char *iso_date,double *d)

{
  byte *pbVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  byte bVar9;
  int iVar10;
  long lVar11;
  double dVar12;
  byte *local_48;
  long local_40;
  long local_38;
  
  lVar8 = _g_ascii_table;
  local_48 = (byte *)(iso_date + -1);
  do {
    bVar9 = local_48[1];
    local_48 = local_48 + 1;
    uVar2 = *(ushort *)(_g_ascii_table + (ulong)bVar9 * 2);
  } while ((uVar2 >> 8 & 1) != 0);
  iVar10 = -1;
  if ((bVar9 != 0) && ((((uVar2 & 8) != 0 || (bVar9 == 0x2d)) || (bVar9 == 0x2b)))) {
    lVar3 = strtol((char *)local_48,(char **)&local_48,10);
    bVar9 = *local_48;
    if (bVar9 == 0x2d) {
      local_48 = local_48 + 1;
      local_40 = strtol((char *)local_48,(char **)&local_48,10);
      pbVar1 = local_48 + 1;
      if (*local_48 != 0x2d) {
        return -1;
      }
      local_48 = pbVar1;
      local_38 = strtol((char *)pbVar1,(char **)&local_48,10);
      bVar9 = *local_48;
      lVar4 = lVar3;
    }
    else {
      local_38 = lVar3 % 100;
      lVar4 = lVar3 / 10000;
      local_40 = (long)(short)((short)(lVar3 % 10000) / 100);
    }
    local_48 = local_48 + 1;
    if (bVar9 == 0x54) {
      lVar3 = strtol((char *)local_48,(char **)&local_48,10);
      bVar9 = *local_48;
      if (bVar9 == 0x3a) {
        local_48 = local_48 + 1;
        lVar5 = strtol((char *)local_48,(char **)&local_48,10);
        pbVar1 = local_48 + 1;
        if (*local_48 != 0x3a) {
          return -1;
        }
        local_48 = pbVar1;
        lVar6 = strtol((char *)pbVar1,(char **)&local_48,10);
        bVar9 = *local_48;
        lVar7 = lVar3;
      }
      else {
        lVar6 = lVar3 % 100;
        lVar7 = lVar3 / 10000;
        lVar5 = (long)(short)((short)(lVar3 % 10000) / 100);
      }
      dVar12 = 0.0;
      if (bVar9 == 0x2e) {
        lVar3 = 100000;
        lVar11 = 0;
        while( true ) {
          local_48 = local_48 + 1;
          if ((*(byte *)(lVar8 + (ulong)*local_48 * 2) & 8) == 0) break;
          lVar11 = lVar11 + ((long)(char)*local_48 + -0x30) * lVar3;
          lVar3 = lVar3 / 10;
        }
        lVar8 = -lVar11;
        if (-1 < lVar6) {
          lVar8 = lVar11;
        }
        dVar12 = (double)lVar8;
      }
      *d = (double)lVar4;
      d[1] = (double)local_40;
      d[2] = (double)local_38;
      d[3] = (double)lVar7;
      d[4] = (double)lVar5;
      d[5] = dVar12 / 1000000.0 + (double)lVar6;
      iVar10 = 0;
    }
  }
  return iVar10;
}

Assistant:

int p2sc_string2date(const char *iso_date, double d[6]) {
    char *date = (char *) iso_date;
    long year, mon, mday, hour, min, sec, usec = 0;
    long val;

    while (g_ascii_isspace(*date))
        date++;

    if (*date == '\0')
        return -1;

    if (!g_ascii_isdigit(*date) && *date != '-' && *date != '+')
        return -1;

    val = strtol(date, &date, 10);
    if (*date == '-') {
        // YYYY-MM-DD
        year = val;
        date++;
        mon = strtol(date, &date, 10);

        if (*date++ != '-')
            return -1;

        mday = strtol(date, &date, 10);
    } else {
        // YYYYMMDD
        mday = val % 100;
        mon = (val % 10000) / 100;
        year = val / 10000;
    }

    if (*date++ != 'T')
        return -1;

    val = strtol(date, &date, 10);
    if (*date == ':') {
        // hh:mm:ss
        hour = val;
        date++;
        min = strtol(date, &date, 10);

        if (*date++ != ':')
            return -1;

        sec = strtol(date, &date, 10);
    } else {
        // hhmmss
        sec = val % 100;
        min = (val % 10000) / 100;
        hour = val / 10000;
    }

    if (*date == '.') {
        glong mul = 100000;

        while (g_ascii_isdigit(*++date)) {
            usec += (*date - '0') * mul;
            mul /= 10;
        }
        if (sec < 0)
            usec = -usec;
    }

    d[0] = year;
    d[1] = mon;
    d[2] = mday;
    d[3] = hour;
    d[4] = min;
    d[5] = sec + usec / 1000000.;

    return 0;
}